

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::_PathArcToFastEx
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_sample,int a_max_sample,int a_step
          )

{
  ImDrawListSharedData *pIVar1;
  ImVec2 IVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ImVec2 *pIVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int a;
  uint uVar12;
  ImVec2 IVar13;
  ImVec2 IVar14;
  
  if (0.0 < radius) {
    if (a_step < 1) {
      uVar5 = _CalcCircleAutoSegmentCount(this,radius);
      a_step = (int)(0x30 / (ulong)uVar5);
    }
    uVar5 = 0xc;
    if ((uint)a_step < 0xc) {
      uVar5 = a_step;
    }
    uVar11 = 1;
    uVar12 = uVar5;
    if (a_step == 0) {
      uVar12 = 1;
    }
    uVar6 = a_max_sample - a_min_sample;
    uVar3 = -uVar6;
    if (0 < (int)uVar6) {
      uVar3 = uVar6;
    }
    if (uVar12 < 2) {
      iVar10 = uVar3 + 1;
      bVar4 = false;
    }
    else if (uVar3 % uVar12 == 0) {
      bVar4 = false;
      iVar10 = uVar3 / uVar12 + 1;
      uVar11 = uVar5;
    }
    else {
      iVar10 = uVar3 / uVar12 + 2;
      bVar4 = true;
      uVar11 = (int)((char)((char)uVar12 - (char)(uVar3 % uVar12)) / -2) + uVar12;
    }
    ImVector<ImVec2>::resize(&this->_Path,(this->_Path).Size + iVar10);
    pIVar8 = (this->_Path).Data + ((long)(this->_Path).Size - (long)iVar10);
    iVar10 = a_min_sample;
    if (0x2f < (uint)a_min_sample) {
      iVar9 = a_min_sample % 0x30;
      iVar10 = iVar9 + 0x30;
      if (-1 < iVar9) {
        iVar10 = iVar9;
      }
    }
    pIVar1 = this->_Data;
    if (a_max_sample < a_min_sample) {
      while (a_max_sample <= a_min_sample) {
        iVar9 = iVar10 + 0x30;
        if (-1 < iVar10) {
          iVar9 = iVar10;
        }
        IVar13.x = (*center).x + pIVar1->ArcFastVtx[iVar9].x * radius;
        IVar13.y = (*center).y + pIVar1->ArcFastVtx[iVar9].y * radius;
        *pIVar8 = IVar13;
        pIVar8 = pIVar8 + 1;
        iVar10 = iVar9 - uVar11;
        a_min_sample = a_min_sample - uVar11;
        uVar11 = uVar12;
      }
    }
    else {
      while (a_min_sample <= a_max_sample) {
        iVar9 = iVar10 + -0x30;
        if (iVar10 < 0x30) {
          iVar9 = iVar10;
        }
        IVar14.x = (*center).x + pIVar1->ArcFastVtx[iVar9].x * radius;
        IVar14.y = (*center).y + pIVar1->ArcFastVtx[iVar9].y * radius;
        *pIVar8 = IVar14;
        pIVar8 = pIVar8 + 1;
        iVar10 = iVar9 + uVar11;
        a_min_sample = a_min_sample + uVar11;
        uVar11 = uVar12;
      }
    }
    if (bVar4) {
      iVar10 = (int)((long)a_max_sample % 0x30);
      uVar7 = (ulong)(iVar10 + 0x30);
      if (-1 < iVar10) {
        uVar7 = (long)a_max_sample % 0x30 & 0xffffffff;
      }
      IVar2.y = radius * pIVar1->ArcFastVtx[uVar7].y + (*center).y;
      IVar2.x = radius * pIVar1->ArcFastVtx[uVar7].x + (*center).x;
      *pIVar8 = IVar2;
    }
    return;
  }
  ImVector<ImVec2>::push_back(&this->_Path,center);
  return;
}

Assistant:

void ImDrawList::_PathArcToFastEx(const ImVec2& center, float radius, int a_min_sample, int a_max_sample, int a_step)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    // Calculate arc auto segment step size
    if (a_step <= 0)
        a_step = IM_DRAWLIST_ARCFAST_SAMPLE_MAX / _CalcCircleAutoSegmentCount(radius);

    // Make sure we never do steps larger than one quarter of the circle
    a_step = ImClamp(a_step, 1, IM_DRAWLIST_ARCFAST_TABLE_SIZE / 4);

    const int sample_range = ImAbs(a_max_sample - a_min_sample);
    const int a_next_step = a_step;

    int samples = sample_range + 1;
    bool extra_max_sample = false;
    if (a_step > 1)
    {
        samples            = sample_range / a_step + 1;
        const int overstep = sample_range % a_step;

        if (overstep > 0)
        {
            extra_max_sample = true;
            samples++;

            // When we have overstep to avoid awkwardly looking one long line and one tiny one at the end,
            // distribute first step range evenly between them by reducing first step size.
            if (sample_range > 0)
                a_step -= (a_step - overstep) / 2;
        }
    }

    _Path.resize(_Path.Size + samples);
    ImVec2* out_ptr = _Path.Data + (_Path.Size - samples);

    int sample_index = a_min_sample;
    if (sample_index < 0 || sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
    {
        sample_index = sample_index % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (sample_index < 0)
            sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
    }

    if (a_max_sample >= a_min_sample)
    {
        for (int a = a_min_sample; a <= a_max_sample; a += a_step, sample_index += a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
                sample_index -= IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }
    else
    {
        for (int a = a_min_sample; a >= a_max_sample; a -= a_step, sample_index -= a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index < 0)
                sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }

    if (extra_max_sample)
    {
        int normalized_max_sample = a_max_sample % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (normalized_max_sample < 0)
            normalized_max_sample += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

        const ImVec2 s = _Data->ArcFastVtx[normalized_max_sample];
        out_ptr->x = center.x + s.x * radius;
        out_ptr->y = center.y + s.y * radius;
        out_ptr++;
    }

    IM_ASSERT_PARANOID(_Path.Data + _Path.Size == out_ptr);
}